

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O3

bool MeCab::anon_unknown_21::is_valid_node<mecab_node_t>(Lattice *lattice,mecab_node_t *node)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar10;
  char *pcVar11;
  undefined8 *puVar12;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  char *pcVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined8 *local_58;
  char *local_50;
  ulong local_48;
  undefined8 *local_40;
  char *local_38;
  
  pcVar15 = node->surface;
  iVar7 = (*lattice->_vptr_Lattice[8])();
  uVar3 = node->length;
  iVar8 = (*lattice->_vptr_Lattice[0x1f])
                    (lattice,pcVar15 + ((ulong)uVar3 - CONCAT44(extraout_var,iVar7)));
  if (iVar8 != 2) {
    pcVar10 = node->surface;
    iVar8 = (*lattice->_vptr_Lattice[8])(lattice);
    uVar4 = node->length;
    uVar5 = node->rlength;
    iVar9 = (*lattice->_vptr_Lattice[0x20])
                      (lattice,pcVar10 + ((ulong)uVar4 -
                                         ((ulong)uVar5 + CONCAT44(extraout_var_00,iVar8))));
    pcVar19 = (char *)CONCAT44(extraout_var_01,iVar9);
    if (pcVar19 == (char *)0x0) {
      return true;
    }
    iVar8 = (*lattice->_vptr_Lattice[0x1f])
                      (lattice,pcVar10 + ((ulong)uVar4 -
                                         ((ulong)uVar5 + CONCAT44(extraout_var_00,iVar8))));
    if ((iVar8 == 1) &&
       (iVar7 = (*lattice->_vptr_Lattice[0x1f])
                          (lattice,pcVar15 + ((ulong)uVar3 - CONCAT44(extraout_var,iVar7))),
       iVar7 == 1)) {
      pcVar15 = node->feature;
      if ((*pcVar19 == '*') && (pcVar19[1] == '\0')) {
        return true;
      }
      pcVar10 = (char *)operator_new__(0x2000);
      local_38 = pcVar10;
      pcVar11 = (char *)operator_new__(0x2000);
      local_50 = pcVar11;
      puVar12 = (undefined8 *)operator_new__(0x200);
      local_40 = puVar12;
      local_58 = (undefined8 *)operator_new__(0x200);
      strncpy(pcVar10,pcVar19,0x2000);
      strncpy(pcVar11,pcVar15,0x2000);
      sVar13 = strlen(pcVar10);
      if ((long)sVar13 < 1) {
        local_48 = 0;
        uVar18 = local_48;
      }
      else {
        pcVar15 = pcVar10 + sVar13;
        local_48 = 0;
        uVar17 = 0x40;
        do {
          for (; (cVar2 = *pcVar10, cVar2 == '\t' || (cVar2 == ' ')); pcVar10 = pcVar10 + 1) {
          }
          if (cVar2 == '\"') {
            pcVar10 = pcVar10 + 1;
            pcVar19 = pcVar10;
            for (pcVar11 = pcVar10;
                (pcVar16 = pcVar11, pcVar11 < pcVar15 &&
                ((cVar2 = *pcVar11, cVar2 != '\"' ||
                 (pcVar16 = pcVar11 + 1, pcVar1 = pcVar11 + 1, pcVar11 = pcVar16, *pcVar1 == '\"')))
                ); pcVar11 = pcVar11 + 1) {
              *pcVar19 = cVar2;
              pcVar19 = pcVar19 + 1;
            }
            local_5b = 0x2c;
            pcVar11 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar16,pcVar15,&local_5b);
          }
          else {
            local_5c = 0x2c;
            pcVar11 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar10,pcVar15,&local_5c);
            pcVar19 = pcVar11;
          }
          if (uVar17 < 2) {
            *puVar12 = pcVar10;
            uVar18 = local_48 + 1;
            if (uVar17 - 1 == 0) break;
          }
          else {
            *pcVar19 = '\0';
            *puVar12 = pcVar10;
          }
          local_48 = local_48 + 1;
          puVar12 = puVar12 + 1;
          pcVar10 = pcVar11 + 1;
          uVar18 = local_48;
          uVar17 = uVar17 - 1;
        } while (pcVar10 < pcVar15);
      }
      local_48 = uVar18;
      pcVar15 = local_50;
      sVar13 = strlen(local_50);
      if ((long)sVar13 < 1) {
        uVar18 = 0;
      }
      else {
        pcVar10 = pcVar15 + sVar13;
        uVar17 = 0;
        puVar12 = local_58;
        uVar14 = 0x40;
        do {
          for (; (cVar2 = *pcVar15, cVar2 == '\t' || (cVar2 == ' ')); pcVar15 = pcVar15 + 1) {
          }
          if (cVar2 == '\"') {
            pcVar15 = pcVar15 + 1;
            pcVar19 = pcVar15;
            for (pcVar11 = pcVar15;
                (pcVar16 = pcVar11, pcVar11 < pcVar10 &&
                ((cVar2 = *pcVar11, cVar2 != '\"' ||
                 (pcVar16 = pcVar11 + 1, pcVar1 = pcVar11 + 1, pcVar11 = pcVar16, *pcVar1 == '\"')))
                ); pcVar11 = pcVar11 + 1) {
              *pcVar19 = cVar2;
              pcVar19 = pcVar19 + 1;
            }
            local_59 = 0x2c;
            pcVar11 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar16,pcVar10,&local_59);
          }
          else {
            local_5a = 0x2c;
            pcVar11 = std::__find_if<char*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                                (pcVar15,pcVar10,&local_5a);
            pcVar19 = pcVar11;
          }
          if (uVar14 < 2) {
            *puVar12 = pcVar15;
            uVar18 = uVar17 + 1;
            if (uVar14 - 1 == 0) break;
          }
          else {
            *pcVar19 = '\0';
            *puVar12 = pcVar15;
          }
          uVar18 = uVar17 + 1;
          puVar12 = puVar12 + 1;
          pcVar15 = pcVar11 + 1;
          uVar17 = uVar18;
          uVar14 = uVar14 - 1;
        } while (pcVar15 < pcVar10);
      }
      puVar6 = local_40;
      puVar12 = local_58;
      uVar17 = local_48;
      if (uVar18 < local_48) {
        uVar17 = uVar18;
      }
      if (uVar17 == 0) {
        operator_delete__(local_58);
        operator_delete__(local_40);
        operator_delete__(local_50);
        operator_delete__(local_38);
        return true;
      }
      bVar20 = false;
      uVar18 = 1;
      do {
        pcVar15 = (char *)puVar6[uVar18 - 1];
        if (((*pcVar15 != '*') || (pcVar15[1] != '\0')) &&
           (iVar7 = strcmp(pcVar15,(char *)puVar12[uVar18 - 1]), iVar7 != 0)) break;
        bVar20 = uVar17 <= uVar18;
        bVar21 = uVar18 != uVar17;
        uVar18 = uVar18 + 1;
      } while (bVar21);
      operator_delete__(puVar12);
      operator_delete__(puVar6);
      operator_delete__(local_50);
      operator_delete__(local_38);
      if (bVar20) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool is_valid_node(const Lattice *lattice,  N *node) {
  const size_t end_pos = node->surface - lattice->sentence() + node->length;
  if (lattice->boundary_constraint(end_pos) == MECAB_INSIDE_TOKEN) {
    return false;
  }
  const size_t begin_pos =
      node->surface - lattice->sentence() + node->length - node->rlength;
  const char *feature = lattice->feature_constraint(begin_pos);
  if (!feature) {
    return true;
  }
  if (lattice->boundary_constraint(begin_pos) == MECAB_TOKEN_BOUNDARY &&
      lattice->boundary_constraint(end_pos) == MECAB_TOKEN_BOUNDARY &&
      partial_match(feature, node->feature)) {
    return true;
  }
  return false;
}